

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_sequences.c
# Opt level: O1

size_t ZSTD_crossEntropyCost(short *norm,uint accuracyLog,uint *count,uint max)

{
  ulong uVar1;
  ulong uVar2;
  short sVar3;
  
  uVar2 = 0;
  uVar1 = 0;
  do {
    sVar3 = norm[uVar2];
    if (norm[uVar2] == -1) {
      sVar3 = 1;
    }
    uVar1 = uVar1 + kInverseProbabilityLog256[(uint)((int)sVar3 << (8U - (char)accuracyLog & 0x1f))]
                    * count[uVar2];
    uVar2 = uVar2 + 1;
  } while (max + 1 + (uint)(max == 0xffffffff) != uVar2);
  return uVar1 >> 8;
}

Assistant:

size_t ZSTD_crossEntropyCost(short const* norm, unsigned accuracyLog,
                             unsigned const* count, unsigned const max)
{
    unsigned const shift = 8 - accuracyLog;
    size_t cost = 0;
    unsigned s;
    assert(accuracyLog <= 8);
    for (s = 0; s <= max; ++s) {
        unsigned const normAcc = (norm[s] != -1) ? (unsigned)norm[s] : 1;
        unsigned const norm256 = normAcc << shift;
        assert(norm256 > 0);
        assert(norm256 < 256);
        cost += count[s] * kInverseProbabilityLog256[norm256];
    }
    return cost >> 8;
}